

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  undefined8 uVar6;
  uint uVar7;
  int *piVar8;
  size_t sVar9;
  seqDef *psVar10;
  BYTE *iStart;
  BYTE *pBVar11;
  BYTE *pBVar12;
  long lVar13;
  int *iend;
  int *ip;
  int *piVar14;
  ulong uVar15;
  U32 UVar16;
  BYTE *pBVar17;
  BYTE *litLimit_w;
  int *ilimit_w;
  BYTE *litEnd;
  U32 local_a0;
  U32 local_9c;
  int local_88;
  size_t offsetFound;
  BYTE *local_58;
  U32 *local_50;
  ulong local_48;
  BYTE *local_40;
  ZSTD_matchState_t *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  local_9c = *rep;
  pZVar4 = ms->dictMatchState;
  pBVar5 = (pZVar4->window).nextSrc;
  local_40 = (pZVar4->window).base;
  local_58 = local_40 + (pZVar4->window).dictLimit;
  local_48 = (ulong)(((int)local_40 - (int)pBVar5) + uVar2);
  local_a0 = rep[1];
  ip = (int *)((ulong)(((int)src - ((int)local_58 + (int)iStart)) + (int)pBVar5 == 0) + (long)src);
  pBVar17 = local_40 + -local_48;
  iEnd = (BYTE *)((long)src + srcSize);
  piVar8 = (int *)((long)src + (srcSize - 8));
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_50 = rep;
  local_38 = ms;
LAB_005b9f70:
  do {
    if (piVar8 <= ip) {
      *local_50 = local_9c;
      local_50[1] = local_a0;
      return (long)iEnd - (long)src;
    }
    local_88 = (int)pBVar3;
    uVar7 = (((int)ip - local_88) - local_9c) + 1;
    if (uVar7 - uVar2 < 0xfffffffd) {
      piVar14 = (int *)(pBVar3 + uVar7);
      if (uVar7 < uVar2) {
        piVar14 = (int *)(local_40 + (uVar7 - (int)local_48));
      }
      iend = (int *)((long)ip + 1);
      if (*piVar14 != *iend) goto LAB_005b9fb8;
      pBVar11 = iEnd;
      if (uVar7 < uVar2) {
        pBVar11 = pBVar5;
      }
      sVar9 = ZSTD_count_2segments((BYTE *)((long)ip + 5),(BYTE *)(piVar14 + 1),iEnd,pBVar11,iStart)
      ;
      sVar9 = sVar9 + 4;
      UVar16 = 1;
    }
    else {
LAB_005b9fb8:
      offsetFound = 999999999;
      sVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                        (local_38,(BYTE *)ip,iEnd,&offsetFound);
      if (sVar9 < 4) {
        ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
        goto LAB_005b9f70;
      }
      if (offsetFound == 0) {
        UVar16 = 1;
        iend = ip;
      }
      else {
        uVar15 = (long)ip + (-0xfffffffe - (long)(pBVar3 + offsetFound));
        pBVar12 = pBVar3;
        pBVar11 = iStart;
        if ((uint)uVar15 < uVar2) {
          pBVar12 = pBVar17;
          pBVar11 = local_58;
        }
        pBVar12 = pBVar12 + (uVar15 & 0xffffffff);
        for (; ((src < ip && (pBVar11 < pBVar12)) && (*(BYTE *)((long)ip + -1) == pBVar12[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar12 = pBVar12 + -1;
          sVar9 = sVar9 + 1;
        }
        local_a0 = local_9c;
        local_9c = (int)offsetFound - 2;
        UVar16 = (int)offsetFound + 1;
        iend = ip;
      }
    }
    uVar15 = (long)iend - (long)src;
    pBVar11 = seqStore->lit;
    if (ilimit_w < iend) {
      ZSTD_safecopyLiterals(pBVar11,(BYTE *)src,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_005ba0db:
      seqStore->lit = seqStore->lit + uVar15;
      psVar10 = seqStore->sequences;
      if (0xffff < uVar15) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar11 = *src;
      *(undefined8 *)(pBVar11 + 8) = uVar6;
      pBVar11 = seqStore->lit;
      if (0x10 < uVar15) {
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar11 + 0x18) = uVar6;
        if (0x20 < (long)uVar15) {
          lVar13 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar13 + 0x20);
            uVar6 = puVar1[1];
            pBVar12 = pBVar11 + lVar13 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar6;
            puVar1 = (undefined8 *)((long)src + lVar13 + 0x30);
            uVar6 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar6;
            lVar13 = lVar13 + 0x20;
          } while (pBVar12 + 0x20 < pBVar11 + uVar15);
        }
        goto LAB_005ba0db;
      }
      seqStore->lit = pBVar11 + uVar15;
      psVar10 = seqStore->sequences;
    }
    psVar10->litLength = (U16)uVar15;
    psVar10->offset = UVar16;
    if (0xffff < sVar9 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar10->matchLength = (U16)(sVar9 - 3);
    seqStore->sequences = psVar10 + 1;
    UVar16 = local_a0;
    for (ip = (int *)((long)iend + sVar9); local_a0 = UVar16, src = ip, ip <= piVar8;
        ip = (int *)((long)ip + sVar9 + 4)) {
      uVar7 = ((int)ip - local_88) - local_a0;
      pBVar11 = pBVar3;
      if (uVar7 < uVar2) {
        pBVar11 = pBVar17;
      }
      if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar11 + uVar7) != *ip)) break;
      pBVar12 = iEnd;
      if (uVar7 < uVar2) {
        pBVar12 = pBVar5;
      }
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar11 + uVar7) + 4),iEnd,pBVar12,iStart)
      ;
      pBVar11 = seqStore->lit;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar11,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar11 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar11 + 8) = uVar6;
      }
      psVar10 = seqStore->sequences;
      psVar10->litLength = 0;
      psVar10->offset = 1;
      if (0xffff < sVar9 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar10->matchLength = (U16)(sVar9 + 1);
      seqStore->sequences = psVar10 + 1;
      UVar16 = local_9c;
      local_9c = local_a0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dedicatedDictSearch);
}